

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O1

int chrono::collision::GetIndex
              (ChVector<double> *vertex,
              vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              *vertexOUT,double tol)

{
  pointer pCVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pCVar1 = (vertexOUT->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(vertexOUT->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  bVar5 = lVar2 != 0;
  if (bVar5) {
    uVar4 = (lVar2 >> 3) * -0x5555555555555555;
    uVar3 = 0;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = pCVar1[uVar3].m_data[0] - vertex->m_data[0];
      auVar8 = vandpd_avx(auVar8,auVar7);
      if (auVar8._0_8_ < tol) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = pCVar1[uVar3].m_data[1] - vertex->m_data[1];
        auVar8 = vandpd_avx(auVar9,auVar7);
        if ((auVar8._0_8_ < tol) &&
           (auVar10._8_8_ = 0, auVar10._0_8_ = pCVar1[uVar3].m_data[2] - vertex->m_data[2],
           auVar8 = vandpd_avx(auVar10,auVar7), auVar8._0_8_ < tol)) {
          if (bVar5) goto LAB_00812a21;
          break;
        }
      }
      uVar3 = (ulong)((int)uVar3 + 1);
      bVar6 = uVar4 - uVar3 != 0;
      bVar5 = uVar3 <= uVar4 && bVar6;
    } while (uVar3 <= uVar4 && bVar6);
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            (vertexOUT,vertex);
  uVar3 = (ulong)((int)((ulong)((long)(vertexOUT->
                                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vertexOUT->
                                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                 - 1);
LAB_00812a21:
  return (int)uVar3;
}

Assistant:

int GetIndex(ChVector<double> vertex, std::vector<ChVector<double> >& vertexOUT, double tol) {
    // Suboptimal: search vertexes with same position and reuse, (in future: adopt hash map..)
    for (unsigned int iv = 0; iv < vertexOUT.size(); iv++) {
        if (vertex.Equals(vertexOUT[iv], tol)) {
            return iv;
        }
    }
    // not found, so add it to new vertexes
    vertexOUT.push_back(vertex);
    return ((int)vertexOUT.size() - 1);
}